

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Signal_PDU::Signal_PDU(Signal_PDU *this,Header *H,KDataStream *stream)

{
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,H);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_00222200;
  DATA_TYPE::EncodingScheme::EncodingScheme(&this->m_EncodingScheme);
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*(this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,1);
  return;
}

Assistant:

Signal_PDU::Signal_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Radio_Communications_Header( H )
{
    Decode( stream, true );
}